

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.h
# Opt level: O2

ReadWriteGraph * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::build(LLVMReadWriteGraphBuilder *this)

{
  CallGraphImpl *in_RAX;
  Function *f;
  RWSubgraph *pRVar1;
  pointer *__ptr;
  StringRef SVar2;
  CallGraph CG;
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> local_18;
  
  if (*(int *)(this->PTA + 0x70) == 3) {
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFromLLVM
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,
               (CallGraph *)0x0);
  }
  else {
    local_18._M_head_impl = in_RAX;
    llvmdg::CallGraph::CallGraph
              ((CallGraph *)&local_18,
               (GenericCallGraph<dg::pta::PSNode_*> *)
               (*(long *)(*(long *)(this->PTA + 0x80) + 0x38) + 0x48));
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFromLLVM
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,
               (CallGraph *)&local_18);
    if (local_18._M_head_impl != (CallGraphImpl *)0x0) {
      (*(local_18._M_head_impl)->_vptr_CallGraphImpl[1])();
    }
  }
  SVar2.Length = *(size_t *)this->_options;
  SVar2.Data = (char *)(this->
                       super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
                       _module;
  f = (Function *)llvm::Module::getFunction(SVar2);
  pRVar1 = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getSubgraph
                     (&this->
                       super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,f
                     );
  (this->graph)._entry = pRVar1;
  return &this->graph;
}

Assistant:

ReadWriteGraph &&build() {
        // FIXME: this is a bit of a hack
        if (!PTA->getOptions().isSVF()) {
            auto *dgpta = static_cast<DGLLVMPointerAnalysis *>(PTA);
            llvmdg::CallGraph CG(dgpta->getPTA()->getPG()->getCallGraph());
            buildFromLLVM(&CG);
        } else {
            buildFromLLVM();
        }

        auto *entry = getModule()->getFunction(_options.entryFunction);
        assert(entry && "Did not find the entry function");
        graph.setEntry(getSubgraph(entry));

        return std::move(graph);
    }